

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::ClearSavedValue(DBIter *this)

{
  long lVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string empty;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::capacity
                    (in_stack_ffffffffffffffe8);
  if (sVar2 < 0x100001) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear(in_RDI);
  }
  else {
    std::__cxx11::string::string(in_stack_ffffffffffffffe0);
    std::swap<char,std::char_traits<char>,std::allocator<char>>
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd25f5d)
    ;
    std::__cxx11::string::~string(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void ClearSavedValue() {
    if (saved_value_.capacity() > 1048576) {
      std::string empty;
      swap(empty, saved_value_);
    } else {
      saved_value_.clear();
    }
  }